

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall Polymerase::MoveBack(Polymerase *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  bool bVar4;
  SpeciesTracker *pSVar5;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->super_MobileElement).start_ < 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_58,"Attempting to assign negative start position to Polymerase object \'"
                   ,&(this->super_MobileElement).name_);
    std::operator+(&local_38,&bStack_58,"\'.");
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = std::operator==(&(this->super_MobileElement).name_,"__ribosome");
  if (bVar4) {
    pSVar5 = SpeciesTracker::Instance();
    if ((pSVar5->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      iVar3 = -3;
      goto LAB_00113af0;
    }
  }
  iVar3 = -1;
LAB_00113af0:
  uVar1 = (this->super_MobileElement).start_;
  uVar2 = (this->super_MobileElement).stop_;
  (this->super_MobileElement).start_ = iVar3 + uVar1;
  (this->super_MobileElement).stop_ = iVar3 + uVar2;
  return;
}

Assistant:

void Polymerase::MoveBack() {
  if (start_ > 0) {
    if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ -= 3;
    stop_ -= 3;
    } else {
      start_--;
      stop_--;
    }
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Polymerase object '" +
        name_ + "'.");
  }
}